

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  CommonArgProperties<Catch::ConfigData> *this_local;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction(&this->boundField);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->detail);
  std::__cxx11::string::string((string *)&this->placeholder);
  return;
}

Assistant:

CommonArgProperties() {}